

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O2

VmValue * CompileVmStringLiteral(ExpressionContext *ctx,VmModule *module,ExprStringLiteral *node)

{
  int iVar1;
  undefined4 extraout_var;
  VmConstant *value_00;
  VmValue *pVVar2;
  uint i;
  ulong uVar3;
  uint size;
  char *value;
  
  size = (node->length & 0xfffffffc) + 4;
  iVar1 = (*ctx->allocator->_vptr_Allocator[2])();
  value = (char *)CONCAT44(extraout_var,iVar1);
  memset(value,0,(ulong)size);
  for (uVar3 = 0; uVar3 < node->length; uVar3 = uVar3 + 1) {
    value[uVar3] = node->value[uVar3];
  }
  value_00 = CreateConstantStruct
                       (module->allocator,(node->super_ExprBase).source,value,size,
                        (node->super_ExprBase).type);
  pVVar2 = anon_unknown.dwarf_11cad6::CheckType(ctx,&node->super_ExprBase,&value_00->super_VmValue);
  return pVVar2;
}

Assistant:

VmValue* CompileVmStringLiteral(ExpressionContext &ctx, VmModule *module, ExprStringLiteral *node)
{
	unsigned size = node->length + 1;

	// Align to 4
	size = (size + 3) & ~3;

	char *value = (char*)ctx.allocator->alloc(size);
	memset(value, 0, size);

	for(unsigned i = 0; i < node->length; i++)
		value[i] = node->value[i];

	return CheckType(ctx, node, CreateConstantStruct(module->allocator, node->source, value, size, node->type));
}